

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

bool SetRange(FRemapTable *table,int start,int end,int first,int last)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  if (end == start) {
    uVar2 = (uint)(last + first) >> 1;
    table->Remap[(uint)start] = GPalette.Remap[uVar2];
    bVar5 = uVar2 == start;
    table->Palette[(uint)start].field_0 = GPalette.BaseColors[table->Remap[(uint)start]].field_0;
    table->Palette[(uint)start].field_0.field_0.a = 0xff;
  }
  else {
    bVar5 = true;
    if (start <= end) {
      uVar4 = (ulong)(uint)start;
      iVar1 = start + -1;
      iVar3 = 0;
      do {
        uVar2 = iVar3 / (end - start) + first;
        table->Remap[uVar4] = GPalette.Remap[(int)uVar2];
        bVar5 = (bool)(bVar5 & uVar4 == uVar2);
        table->Palette[uVar4].field_0 = GPalette.BaseColors[table->Remap[uVar4]].field_0;
        table->Palette[uVar4].field_0.field_0.a = 0xff;
        uVar4 = uVar4 + 1;
        iVar3 = iVar3 + (last - first);
        iVar1 = iVar1 + 1;
      } while (iVar1 < end);
    }
  }
  return bVar5;
}

Assistant:

static bool SetRange(FRemapTable *table, int start, int end, int first, int last)
{
	bool identity = true;
	if (start == end)
	{
		int pi = (first + last) / 2;
		table->Remap[start] = GPalette.Remap[pi];
		identity &= (pi == start);
		table->Palette[start] = GPalette.BaseColors[table->Remap[start]];
		table->Palette[start].a = 255;
	}
	else
	{
		int palrange = last - first;
		for (int i = start; i <= end; ++i)
		{
			int pi = first + palrange * (i - start) / (end - start);
			table->Remap[i] = GPalette.Remap[pi];
			identity &= (pi == i);
			table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
			table->Palette[i].a = 255;
		}
	}
	return identity;
}